

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_incchr(int *ip)

{
  t_symbol *ptVar1;
  int iVar2;
  int size;
  int iVar3;
  int iVar4;
  int iVar5;
  int h;
  int w;
  int y;
  int x;
  uchar buffer [32];
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar2 = pcx_get_args(ip);
  if (iVar2 != 0) {
    iVar3 = 0;
    iVar2 = pcx_parse_args(0,pcx_nb_args,&x,&y,&w,&h,8);
    if (iVar2 != 0) {
      for (iVar2 = 0; ptVar1 = lablptr, iVar2 < h; iVar2 = iVar2 + 1) {
        iVar4 = 0;
        for (iVar5 = 0; iVar5 < w; iVar5 = iVar5 + 1) {
          size = pcx_pack_8x8_tile(buffer,x + iVar4,y + iVar2 * 8);
          iVar3 = iVar3 + size;
          putbuffer(buffer,size);
          iVar4 = iVar4 + 8;
        }
      }
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 9)) {
          lastlabl->data_size = lastlabl->data_size + iVar3;
        }
      }
      else {
        lablptr->data_type = 9;
        ptVar1->data_size = iVar3;
      }
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
do_incchr(int *ip)
{
	unsigned char buffer[32];
	int i, j;
	int x, y, w, h;
	int tx, ty;
	int total = 0;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 8))
		return;

	/* pack data */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* tile coordinates */
			tx = x + (j << 3);
			ty = y + (i << 3);

			/* get tile */
			size   = pcx_pack_8x8_tile(buffer, tx, ty);
			total += size;

			/* store tile */
			putbuffer(buffer, size);
		}
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCCHR;
		lablptr->data_size = total;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCCHR)
				lastlabl->data_size += total;
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}